

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O1

void WebRtcIsac_InitPitchFilter(PitchFiltstr *pitchfiltdata)

{
  memset(pitchfiltdata,0,0x5f0);
  pitchfiltdata->ystate[0] = 0.0;
  pitchfiltdata->ystate[1] = 0.0;
  pitchfiltdata->ystate[2] = 0.0;
  pitchfiltdata->ystate[3] = 0.0;
  pitchfiltdata->ystate[4] = 0.0;
  pitchfiltdata->oldlagp[0] = 50.0;
  pitchfiltdata->oldgainp[0] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPitchFilter(PitchFiltstr *pitchfiltdata)
{
  int k;

  for (k = 0; k < PITCH_BUFFSIZE; k++) {
    pitchfiltdata->ubuf[k] = 0.0;
  }
  pitchfiltdata->ystate[0] = 0.0;
  for (k = 1; k < (PITCH_DAMPORDER); k++) {
    pitchfiltdata->ystate[k] = 0.0;
  }
  pitchfiltdata->oldlagp[0] = 50.0;
  pitchfiltdata->oldgainp[0] = 0.0;
}